

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O2

void __thiscall axl::io::ShmtBase::disconnect(ShmtBase *this)

{
  ShmtFileHdr *pSVar1;
  __sighandler_t __handler;
  __sighandler_t extraout_RDX;
  __sighandler_t __handler_00;
  
  sys::atomicLock(&this->m_hdr->m_lock);
  pSVar1 = this->m_hdr;
  pSVar1->m_state = pSVar1->m_state | 4;
  __handler_00 = __handler;
  if (pSVar1->m_readSemaphoreWaitCount != 0) {
    sys::NamedSemaphore::signal(&this->m_readSemaphore,pSVar1->m_readSemaphoreWaitCount,__handler);
    pSVar1 = this->m_hdr;
    pSVar1->m_readSemaphoreWaitCount = 0;
    __handler_00 = extraout_RDX;
  }
  if (pSVar1->m_writeSemaphoreWaitCount != 0) {
    sys::NamedSemaphore::signal
              (&this->m_writeSemaphore,pSVar1->m_writeSemaphoreWaitCount,__handler_00);
    pSVar1 = this->m_hdr;
    pSVar1->m_writeSemaphoreWaitCount = 0;
  }
  LOCK();
  if (pSVar1->m_lock == 1) {
    pSVar1->m_lock = 0;
  }
  UNLOCK();
  return;
}

Assistant:

void
ShmtBase::disconnect() {
	sys::atomicLock(&m_hdr->m_lock);

	m_hdr->m_state |= ShmtState_Disconnected;

	if (m_hdr->m_readSemaphoreWaitCount) {
		m_readSemaphore.signal(m_hdr->m_readSemaphoreWaitCount);
		m_hdr->m_readSemaphoreWaitCount = 0;
	}

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);
}